

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_list.c
# Opt level: O2

void insertElement(VM *vm,ObjList *objList,uint32_t index,Value value)

{
  undefined8 *puVar1;
  uint32_t uVar2;
  Value *pVVar3;
  anon_union_8_2_14f5a2bf_for_Value_1 aVar4;
  long lVar5;
  uint uVar6;
  
  if ((objList->elements).count - 1 < index) {
    errorReport((void *)0x0,ERROR_RUNTIME,"index out bounded!");
  }
  ValueBufferAdd(vm,&objList->elements,(Value)ZEXT816(1));
  uVar2 = (objList->elements).count;
  uVar6 = uVar2 - 2;
  lVar5 = (ulong)(uVar2 - 1) << 4;
  while( true ) {
    pVVar3 = (objList->elements).datas;
    if (uVar6 + 1 <= index) break;
    aVar4 = pVVar3[uVar6].field_1;
    puVar1 = (undefined8 *)((long)&pVVar3->type + lVar5);
    *puVar1 = *(undefined8 *)(pVVar3 + uVar6);
    *(anon_union_8_2_14f5a2bf_for_Value_1 *)(puVar1 + 1) = aVar4;
    uVar6 = uVar6 - 1;
    lVar5 = lVar5 + -0x10;
  }
  pVVar3[index].type = value.type;
  pVVar3[index].field_1 = value.field_1;
  return;
}

Assistant:

void insertElement(VM *vm, ObjList *objList, uint32_t index, Value value) {
    if (index > objList->elements.count - 1) {
        RUN_ERROR("index out bounded!");
    }

    // 增加一个空位
    ValueBufferAdd(vm, &objList->elements, VT_TO_VALUE(VT_NULL));

    // index后面的元素整体后移一位
    uint32_t idx = objList->elements.count - 1;
    while (idx > index) {
        objList->elements.datas[idx] = objList->elements.datas[idx - 1];
        idx--;
    }

    // 插入Value
    objList->elements.datas[index] = value;
}